

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

QString * escapeHtml(QString *__return_storage_ptr__,QString *input)

{
  char16_t cVar1;
  int iVar2;
  size_t sVar3;
  char *s;
  long lVar4;
  int iVar5;
  QLatin1String local_58;
  QArrayDataPointer<char16_t> local_48;
  
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&input->d);
  iVar5 = 0;
  do {
    lVar4 = (long)iVar5;
    if ((__return_storage_ptr__->d).size <= lVar4) {
      return __return_storage_ptr__;
    }
    cVar1 = (__return_storage_ptr__->d).ptr[lVar4];
    if (cVar1 == L'\"') {
      s = "&quot;";
LAB_00110778:
      QLatin1String::QLatin1String(&local_58,s);
      QString::QString((QString *)&local_48,local_58);
      QString::replace((longlong)__return_storage_ptr__,lVar4,(QString *)0x1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      sVar3 = strlen(s);
      iVar2 = (int)sVar3;
    }
    else {
      s = "&amp;";
      if (cVar1 == L'&') goto LAB_00110778;
      if (cVar1 == L'>') {
        s = "&gt;";
        goto LAB_00110778;
      }
      iVar2 = 1;
      if (cVar1 == L'<') {
        s = "&lt;";
        goto LAB_00110778;
      }
    }
    iVar5 = iVar5 + iVar2;
  } while( true );
}

Assistant:

QString escapeHtml(const QString& input)
{
	QString escaped(input);
	for (int i=0; i < escaped.length();) {
		const char* replacement = 0;
		ushort ch = escaped.at(i).unicode();
		if (ch == '&') {
			replacement = "&amp;";
		} else if (ch == '<') {
			replacement = "&lt;";
		} else if (ch == '>') {
			replacement = "&gt;";
		} else if (ch == '"') {
			replacement = "&quot;";
		}
		if (replacement) {
			escaped.replace(i, 1, QLatin1String(replacement));
			i += (int)strlen(replacement);
		} else {
			++i;
		}
	}
	return escaped;
}